

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTADSBHub.cpp
# Opt level: O2

string * VRSString_abi_cxx11_(string *__return_storage_ptr__,uint8_t **pStart)

{
  byte *pbVar1;
  
  pbVar1 = *pStart;
  *pStart = pbVar1 + (ulong)*pbVar1 + 1;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pbVar1 + 1);
  return __return_storage_ptr__;
}

Assistant:

std::string VRSString (const uint8_t* &pStart)
{
    size_t sLen = size_t(pStart[0]);
    ++pStart;                           // eat the length byte
    const char* pS = (const char*)pStart;
    pStart += sLen;                     // eat the actual string
    return std::string(pS, sLen);
}